

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_memory_error.h
# Opt level: O0

double __thiscall nodecpp::error::memory_error_domain::log(memory_error_domain *this,double __x)

{
  bool bVar1;
  char *pcVar2;
  LogLevel in_ECX;
  Log *in_RDX;
  Log *in_RSI;
  double __x_00;
  double dVar3;
  double extraout_XMM0_Qa;
  string_ref local_58 [2];
  string_ref local_38;
  LogLevel local_24;
  Log *pLStack_20;
  LogLevel l_local;
  Log *targetLog_local;
  error_value *value_local;
  memory_error_domain *this_local;
  
  local_24 = in_ECX;
  pLStack_20 = in_RDX;
  targetLog_local = in_RSI;
  value_local = (error_value *)this;
  bVar1 = impl::isDataStackInfo((StackInfo *)&in_RSI->levelCouldBeSkipped);
  if (bVar1) {
    (*(this->super_error_domain)._vptr_error_domain[1])(&local_38,this,targetLog_local);
    pcVar2 = string_ref::c_str(&local_38);
    nodecpp::log::Log::log<char_const*,char_const*>(pLStack_20,local_24,"{} happened at",pcVar2);
    string_ref::~string_ref(&local_38);
    dVar3 = StackInfo::log((StackInfo *)&targetLog_local->levelCouldBeSkipped,__x_00);
  }
  else {
    (*(this->super_error_domain)._vptr_error_domain[1])(local_58,this,targetLog_local);
    pcVar2 = string_ref::c_str(local_58);
    nodecpp::log::Log::log<char_const*,char_const*>(pLStack_20,local_24,"{}",pcVar2);
    string_ref::~string_ref(local_58);
    dVar3 = extraout_XMM0_Qa;
  }
  return dVar3;
}

Assistant:

virtual void log(error_value* value, log::Log& targetLog, log::LogLevel l ) const { 
			if ( ::nodecpp::impl::isDataStackInfo( value->stackInfo ) )
			{
				targetLog.log( l, "{} happened at", value_to_message( value ).c_str() );
				value->stackInfo.log( targetLog, l );
			}
			else
				targetLog.log( l, "{}", value_to_message( value ).c_str() );
		}